

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::create(Mat *this,int _w,int _h,size_t _elemsize,Allocator *_allocator)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  size_t sVar3;
  ulong uVar4;
  
  if ((((this->dims != 2) || (this->w != _w)) || (this->h != _h)) ||
     (((this->elemsize != _elemsize || (this->elempack != 1)) || (this->allocator != _allocator))))
  {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 2;
    this->w = _w;
    this->h = _h;
    this->d = 1;
    this->c = 1;
    sVar3 = (long)_h * (long)_w;
    this->cstep = sVar3;
    if (sVar3 != 0) {
      uVar4 = sVar3 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar2 = fastMalloc(uVar4 + 4);
      }
      else {
        iVar1 = (*_allocator->_vptr_Allocator[2])(_allocator);
        pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
      }
      this->data = pvVar2;
      this->refcount = (int *)((long)pvVar2 + uVar4);
      *(undefined4 *)((long)pvVar2 + uVar4) = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 2 && w == _w && h == _h && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 2;
    w = _w;
    h = _h;
    d = 1;
    c = 1;

    cstep = (size_t)w * h;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}